

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

void icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
               (AffixPatternProvider *patternInfo,bool isPrefix,int8_t signum,
               UNumberSignDisplay signDisplay,Form plural,bool perMilleReplacesPercent,
               UnicodeString *output)

{
  ushort uVar1;
  Form FVar2;
  ushort uVar3;
  char16_t cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char16_t cVar9;
  Form FVar10;
  byte bVar11;
  int iVar12;
  byte bVar13;
  
  if ((signum == -1) ||
     (((signDisplay != UNUM_SIGN_ALWAYS && (signDisplay != UNUM_SIGN_ACCOUNTING_ALWAYS)) &&
      (1 < signDisplay - UNUM_SIGN_EXCEPT_ZERO || signum != '\x01')))) {
    bVar13 = 0;
  }
  else {
    iVar5 = (*patternInfo->_vptr_AffixPatternProvider[6])(patternInfo);
    bVar13 = (byte)iVar5 ^ 1;
  }
  uVar6 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
  if ((char)uVar6 == '\x01' && signum != -1) {
    iVar5 = (*patternInfo->_vptr_AffixPatternProvider[8])(patternInfo);
    uVar6 = (uint)((byte)iVar5 & bVar13);
  }
  FVar10 = (uVar6 & 0xff) << 9;
  FVar2 = FVar10 | 0x100;
  if (!isPrefix) {
    FVar2 = FVar10;
  }
  iVar5 = 0;
  if (plural == COUNT) {
    plural = ZERO;
  }
  bVar11 = 0;
  if (isPrefix && (char)uVar6 == '\0') {
    bVar11 = signDisplay != UNUM_SIGN_NEVER;
    if (signum != -1) {
      bVar11 = bVar13;
    }
  }
  iVar7 = (*patternInfo->_vptr_AffixPatternProvider[3])(patternInfo,(ulong)(plural | FVar2));
  iVar7 = iVar7 + (uint)bVar11;
  uVar1 = (output->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  (output->fUnion).fStackFields.fLengthAndFlags = uVar3;
  iVar12 = -(uint)bVar11;
  for (; iVar7 != iVar5; iVar5 = iVar5 + 1) {
    cVar4 = L'-';
    if (((byte)iVar12 & iVar5 == 0) == 0) {
      iVar8 = (*patternInfo->_vptr_AffixPatternProvider[2])
                        (patternInfo,(ulong)(plural | FVar2),(ulong)(uint)(iVar12 + iVar5));
      cVar4 = (char16_t)iVar8;
    }
    cVar9 = L'+';
    if (cVar4 != L'-') {
      cVar9 = cVar4;
    }
    if (bVar13 != 0) {
      cVar4 = cVar9;
    }
    cVar9 = cVar4;
    if (perMilleReplacesPercent) {
      cVar9 = L'‰';
    }
    if (cVar4 != L'%') {
      cVar9 = cVar4;
    }
    UnicodeString::append(output,cVar9);
  }
  return;
}

Assistant:

void PatternStringUtils::patternInfoToStringBuilder(const AffixPatternProvider& patternInfo, bool isPrefix,
                                                    int8_t signum, UNumberSignDisplay signDisplay,
                                                    StandardPlural::Form plural,
                                                    bool perMilleReplacesPercent, UnicodeString& output) {

    // Should the output render '+' where '-' would normally appear in the pattern?
    bool plusReplacesMinusSign = signum != -1 && (
            signDisplay == UNUM_SIGN_ALWAYS || signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS || (
                    signum == 1 && (
                            signDisplay == UNUM_SIGN_EXCEPT_ZERO ||
                            signDisplay == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO))) &&
                                 patternInfo.positiveHasPlusSign() == false;

    // Should we use the affix from the negative subpattern? (If not, we will use the positive
    // subpattern.)
    bool useNegativeAffixPattern = patternInfo.hasNegativeSubpattern() && (
            signum == -1 || (patternInfo.negativeHasMinusSign() && plusReplacesMinusSign));

    // Resolve the flags for the affix pattern.
    int flags = 0;
    if (useNegativeAffixPattern) {
        flags |= AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN;
    }
    if (isPrefix) {
        flags |= AffixPatternProvider::AFFIX_PREFIX;
    }
    if (plural != StandardPlural::Form::COUNT) {
        U_ASSERT(plural == (AffixPatternProvider::AFFIX_PLURAL_MASK & plural));
        flags |= plural;
    }

    // Should we prepend a sign to the pattern?
    bool prependSign;
    if (!isPrefix || useNegativeAffixPattern) {
        prependSign = false;
    } else if (signum == -1) {
        prependSign = signDisplay != UNUM_SIGN_NEVER;
    } else {
        prependSign = plusReplacesMinusSign;
    }

    // Compute the length of the affix pattern.
    int length = patternInfo.length(flags) + (prependSign ? 1 : 0);

    // Finally, set the result into the StringBuilder.
    output.remove();
    for (int index = 0; index < length; index++) {
        char16_t candidate;
        if (prependSign && index == 0) {
            candidate = u'-';
        } else if (prependSign) {
            candidate = patternInfo.charAt(flags, index - 1);
        } else {
            candidate = patternInfo.charAt(flags, index);
        }
        if (plusReplacesMinusSign && candidate == u'-') {
            candidate = u'+';
        }
        if (perMilleReplacesPercent && candidate == u'%') {
            candidate = u'‰';
        }
        output.append(candidate);
    }
}